

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reset.cpp
# Opt level: O1

void __thiscall Reset_order_Test::~Reset_order_Test(Reset_order_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Reset, order)
{
    libcellml::ResetPtr r = libcellml::Reset::create();

    EXPECT_FALSE(r->isOrderSet());
    r->setOrder(1);

    EXPECT_EQ(1, r->order());
    EXPECT_TRUE(r->isOrderSet());

    r->removeOrder();
    EXPECT_EQ(int(0), r->order());
    EXPECT_FALSE(r->isOrderSet());
}